

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall HModel::load_fromToy(HModel *this,char *filename)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  char *in_RSI;
  long in_RDI;
  double dVar5;
  int c_n_3;
  int numIntegerColumn;
  int r_n_2;
  int c_n_2;
  double r_v_1;
  double *in_stack_00000088;
  int r_n_1;
  int el_n;
  int c_n_1;
  double r_v;
  int r_n;
  int c_n;
  int numNz;
  int RtCd;
  int *intColumn;
  double *ub;
  double *lb;
  double *c;
  double *b;
  double *A;
  HModel *in_stack_ffffffffffffff00;
  HTimer *this_00;
  HModel *this_01;
  long *__new_size;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  value_type vVar6;
  int local_98;
  uint local_94;
  int local_90;
  int local_8c;
  int local_7c;
  int local_78;
  int local_74;
  int local_68;
  int local_64;
  uint local_60;
  long local_58;
  undefined1 local_50 [16];
  double local_40;
  double local_38;
  double local_30;
  char *local_28;
  
  local_28 = in_RSI;
  clearModel(in_stack_ffffffffffffff00);
  *(undefined8 *)(in_RDI + 0x568) = 0;
  HTimer::reset((HTimer *)in_stack_ffffffffffffff00);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x628),local_28);
  this_00 = (HTimer *)&stack0xffffffffffffffc0;
  this_01 = (HModel *)local_50;
  __new_size = &local_58;
  iVar2 = readToy_MIP_cpp(_numNz,_r_n,(int *)r_v,_el_n,in_stack_00000088,(double **)r_v_1,
                          (double **)lb,(double **)c,(double **)b,(double **)A,(int **)filename);
  if (iVar2 == 0) {
    printf("Model has %3d rows and %3d cols\n",(ulong)*(uint *)(in_RDI + 0x610),
           (ulong)*(uint *)(in_RDI + 0x60c));
    printf("Model has Objective sense is %d; Objective offset is %g\n",
           *(undefined8 *)(in_RDI + 0x620),(ulong)*(uint *)(in_RDI + 0x61c));
    local_60 = 0;
    for (local_64 = 0; local_64 < *(int *)(in_RDI + 0x60c); local_64 = local_64 + 1) {
      for (local_68 = 0; local_68 < *(int *)(in_RDI + 0x610); local_68 = local_68 + 1) {
        dVar5 = *(double *)
                 ((long)local_30 + (long)(local_68 + local_64 * *(int *)(in_RDI + 0x610)) * 8);
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          local_60 = local_60 + 1;
        }
      }
    }
    printf("Model has %d nonzeros\n",(ulong)local_60);
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,(size_type)__new_size)
    ;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,(size_type)__new_size)
    ;
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff20,(size_type)__new_size);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),0);
    *pvVar3 = 0;
    for (local_74 = 0; local_74 < *(int *)(in_RDI + 0x60c); local_74 = local_74 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)local_74);
      local_78 = *pvVar3;
      for (local_7c = 0; local_7c < *(int *)(in_RDI + 0x610); local_7c = local_7c + 1) {
        dVar5 = *(double *)
                 ((long)local_30 + (long)(local_7c + local_74 * *(int *)(in_RDI + 0x610)) * 8);
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_78);
          *pvVar3 = local_7c;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                              (long)local_78);
          *pvVar4 = dVar5;
          local_78 = local_78 + 1;
        }
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(local_74 + 1)
                         );
      *pvVar3 = local_78;
    }
    printf("Model has sparse matrix\n");
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff20,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff20,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff20,(size_type)__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,(size_type)__new_size)
    ;
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff20,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff20,(size_type)__new_size);
    for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x60c); local_8c = local_8c + 1) {
      vVar6 = *(value_type *)((long)local_40 + (long)local_8c * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),(long)local_8c
                         );
      *pvVar4 = vVar6;
      vVar6 = *(value_type *)(local_50._8_8_ + (long)local_8c * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),(long)local_8c
                         );
      *pvVar4 = vVar6;
      vVar6 = *(value_type *)(local_50._0_8_ + (long)local_8c * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),(long)local_8c
                         );
      *pvVar4 = vVar6;
      vVar1 = *(value_type *)(local_58 + (long)local_8c * 4);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x738),(long)local_8c);
      *pvVar3 = vVar1;
    }
    printf("Model has column data\n");
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    for (local_90 = 0; local_90 < *(int *)(in_RDI + 0x610); local_90 = local_90 + 1) {
      vVar6 = *(value_type *)((long)local_38 + (long)local_90 * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),(long)local_90
                         );
      *pvVar4 = vVar6;
      vVar6 = *(value_type *)((long)local_38 + (long)local_90 * 8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),(long)local_90
                         );
      *pvVar4 = vVar6;
    }
    local_94 = 0;
    for (local_98 = 0; local_98 < *(int *)(in_RDI + 0x60c); local_98 = local_98 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x738),(long)local_98);
      if (*pvVar3 != 0) {
        local_94 = local_94 + 1;
      }
    }
    if (local_94 != 0) {
      printf("MPS file has %d integer variables\n",(ulong)local_94);
    }
    *(int *)(in_RDI + 0x614) = *(int *)(in_RDI + 0x60c) + *(int *)(in_RDI + 0x610);
    initScale(this_01);
    initWithLogicalBasis(this_01);
    dVar5 = HTimer::getTime(this_00);
    *(double *)(in_RDI + 0x568) = dVar5 + *(double *)(in_RDI + 0x568);
  }
  else {
    dVar5 = HTimer::getTime(this_00);
    *(double *)(in_RDI + 0x568) = dVar5 + *(double *)(in_RDI + 0x568);
  }
  return iVar2;
}

Assistant:

int HModel::load_fromToy(const char *filename) {
  //  int m, n, maxmin;
  //double offset;
  double *A, *b, * c, *lb, *ub;
  int *intColumn;
  // Remove any current model
  clearModel();
  
  // Initialise the total runtine for this model
  totalTime = 0;

  // Load the model, timing the process
  timer.reset();
  modelName = filename;

  int RtCd = readToy_MIP_cpp(filename, &numRow, &numCol, &objSense, &objOffset,
			     &A,
			     &b, &c, &lb, &ub,
			     &intColumn);
  if (RtCd) {
    totalTime += timer.getTime();
    return RtCd;
  }
  printf("Model has %3d rows and %3d cols\n", numRow, numCol);
  printf("Model has Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
  int numNz = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A[r_n+c_n*numRow];
      if (r_v != 0) numNz++;
    }
  }
  printf("Model has %d nonzeros\n", numNz);cout<<flush;
  Astart.resize(numCol+1);
  Aindex.resize(numNz);
  Avalue.resize(numNz);
  Astart[0] = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    int el_n = Astart[c_n];
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A[r_n+c_n*numRow];
      if (r_v != 0) {
  	Aindex[el_n] = r_n;
  	Avalue[el_n] = r_v;
  	el_n++;
      }
    }
    Astart[c_n+1] = el_n;
  }
  printf("Model has sparse matrix\n");cout<<flush;
  colCost.resize(numCol);
  colLower.resize(numCol);
  colUpper.resize(numCol);
  integerColumn.resize(numCol);
  rowLower.resize(numRow);
  rowUpper.resize(numRow);

  for (int c_n = 0; c_n<numCol; c_n++) {
    colCost[c_n] = c[c_n];
    colLower[c_n] = lb[c_n];
    colUpper[c_n] = ub[c_n];
    integerColumn[c_n] = intColumn[c_n];
  }
  printf("Model has column data\n");cout<<flush;
  for (int r_n = 0; r_n<numRow; r_n++) {
    rowLower[r_n] = b[r_n];
    rowUpper[r_n] = b[r_n];
  }  
#ifdef JAJH_dev
  int numIntegerColumn = 0;
  for (int c_n=0; c_n<numCol; c_n++) {
    if (integerColumn[c_n]) numIntegerColumn++;
  }
  if (numIntegerColumn) printf("MPS file has %d integer variables\n", numIntegerColumn);
#endif
 
  numTot = numCol + numRow;

#ifdef JAJH_dev
  //Use this next line to check the loading of a model from arrays
  //check_load_fromArrays(); return;
#endif

  // Assign and initialise the scaling factors
  initScale();
  
  // Initialise with a logical basis then allocate and populate (where
  // possible) work* arrays and allocate basis* arrays
  initWithLogicalBasis();

  totalTime += timer.getTime();
  return RtCd;
}